

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,Method_arg *ptr)

{
  Type *second;
  Method_arg *first;
  allocator<char> local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Method_arg *local_18;
  Method_arg *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (Method_arg *)this;
  std::operator+(&local_38,"arg: ",ptr->name);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  first = local_18;
  second = local_18->type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"type",&local_69);
  arrow(this,first,second,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  (**(local_18->type->super_Base)._vptr_Base)(local_18->type,this);
  return;
}

Assistant:

void gv_visitor::visit(Method_arg* ptr) {
    box(ptr, "arg: " + *ptr->name);
    arrow(ptr, ptr->type, "type");
    ptr->type->accept(this);
}